

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_open(char *__file,int __oflag,...)

{
  int n;
  int iVar1;
  int iVar2;
  va_list ap;
  uint local_b8;
  
  if ((__oflag & 0x40U) == 0) {
    n = open(__file,__oflag);
  }
  else {
    n = open(__file,__oflag,(ulong)local_b8);
  }
  iVar2 = -1;
  if ((n != -1) && (iVar1 = lws_plat_apply_FD_CLOEXEC(n), iVar2 = n, iVar1 != 0)) {
    close(n);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int lws_open(const char *__file, int __oflag, ...)
{
	va_list ap;
	int n;

	va_start(ap, __oflag);
	if (((__oflag & O_CREAT) == O_CREAT)
#if defined(O_TMPFILE)
		|| ((__oflag & O_TMPFILE) == O_TMPFILE)
#endif
	)
		/* last arg is really a mode_t.  But windows... */
		n = open(__file, __oflag, va_arg(ap, uint32_t));
	else
		n = open(__file, __oflag);
	va_end(ap);

	if (n != -1 && lws_plat_apply_FD_CLOEXEC(n)) {
		close(n);

		return -1;
	}

	return n;
}